

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.hpp
# Opt level: O1

IndexVector * __thiscall
Centaurus::CharClass<char>::collect_borders
          (IndexVector *__return_storage_ptr__,CharClass<char> *this)

{
  pointer pRVar1;
  iterator iVar2;
  undefined8 in_RAX;
  Range<char> *r;
  pointer pRVar3;
  undefined8 local_38;
  
  local_38 = in_RAX;
  IndexVector::IndexVector
            (__return_storage_ptr__,
             (long)(this->m_ranges).
                   super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_ranges).
                   super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,true);
  pRVar3 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pRVar3 != pRVar1) {
    do {
      local_38 = (ulong)CONCAT14(pRVar3->m_start,(int)local_38);
      iVar2._M_current =
           (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,iVar2,
                   (int *)((long)&local_38 + 4));
      }
      else {
        *iVar2._M_current = (uint)(byte)pRVar3->m_start;
        (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar2._M_current + 1;
      }
      local_38 = CONCAT44(local_38._4_4_,(uint)(byte)pRVar3->m_end);
      iVar2._M_current =
           (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&__return_storage_ptr__->super_vector<int,_std::allocator<int>_>,iVar2,
                   (int *)&local_38);
      }
      else {
        *iVar2._M_current = (uint)(byte)pRVar3->m_end;
        (__return_storage_ptr__->super_vector<int,_std::allocator<int>_>).
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar2._M_current + 1;
      }
      pRVar3 = pRVar3 + 1;
    } while (pRVar3 != pRVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

IndexVector collect_borders() const
    {
        IndexVector ret(2 * m_ranges.size(), true);

        for (const auto& r : m_ranges)
        {
            ret.push_back(r.start());
            ret.push_back(r.end());
        }

        return ret;
    }